

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int * __thiscall ImGuiStorage::GetIntRef(ImGuiStorage *this,ImGuiID key,int default_val)

{
  ImVector<ImGuiStorage::ImGuiStoragePair> *this_00;
  ImVector<ImGuiStorage::ImGuiStoragePair> *pIVar1;
  int in_EDX;
  ImGuiID in_ESI;
  ImVector<ImGuiStorage::ImGuiStoragePair> *in_RDI;
  ImGuiStoragePair *it;
  ImGuiStoragePair local_28;
  ImVector<ImGuiStorage::ImGuiStoragePair> *local_18;
  int local_10;
  ImGuiID local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  this_00 = (ImVector<ImGuiStorage::ImGuiStoragePair> *)LowerBound(in_RDI,in_ESI);
  local_18 = this_00;
  pIVar1 = (ImVector<ImGuiStorage::ImGuiStoragePair> *)
           ImVector<ImGuiStorage::ImGuiStoragePair>::end(in_RDI);
  if ((this_00 == pIVar1) || (local_18->Size != local_c)) {
    pIVar1 = local_18;
    ImGuiStoragePair::ImGuiStoragePair(&local_28,local_c,local_10);
    local_18 = (ImVector<ImGuiStorage::ImGuiStoragePair> *)
               ImVector<ImGuiStorage::ImGuiStoragePair>::insert
                         (this_00,(ImGuiStoragePair *)in_RDI,(ImGuiStoragePair *)pIVar1);
  }
  return (int *)&local_18->Data;
}

Assistant:

int* ImGuiStorage::GetIntRef(ImGuiID key, int default_val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, ImGuiStoragePair(key, default_val));
    return &it->val_i;
}